

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O1

void __thiscall FConfigFile::MoveSectionToStart(FConfigFile *this,char *name)

{
  FConfigSection *pFVar1;
  FConfigSection *pFVar2;
  FConfigSection **ppFVar3;
  int iVar4;
  FConfigSection **ppFVar5;
  
  pFVar1 = this->Sections;
  while ((pFVar1 != (FConfigSection *)0x0 &&
         (iVar4 = strcasecmp((pFVar1->SectionName).Chars,name), iVar4 != 0))) {
    pFVar1 = pFVar1->Next;
  }
  if (pFVar1 != (FConfigSection *)0x0) {
    ppFVar3 = &this->Sections;
    do {
      ppFVar5 = ppFVar3;
      pFVar2 = *ppFVar5;
      if (pFVar2 == (FConfigSection *)0x0) break;
      ppFVar3 = &pFVar2->Next;
    } while (pFVar2 != pFVar1);
    *ppFVar5 = pFVar1->Next;
    pFVar1->Next = this->Sections;
    this->Sections = pFVar1;
    if (this->LastSectionPtr == &pFVar1->Next) {
      this->LastSectionPtr = ppFVar5;
    }
  }
  return;
}

Assistant:

void FConfigFile::MoveSectionToStart (const char *name)
{
	FConfigSection *section = FindSection (name);

	if (section != NULL)
	{
		FConfigSection **prevsec = &Sections;
		while (*prevsec != NULL && *prevsec != section)
		{
			prevsec = &((*prevsec)->Next);
		}
		*prevsec = section->Next;
		section->Next = Sections;
		Sections = section;
		if (LastSectionPtr == &section->Next)
		{
			LastSectionPtr = prevsec;
		}
	}
}